

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover_cpu.cxx
# Opt level: O0

Mat * __thiscall
FlickerRemoverCPU::removeFlickering
          (FlickerRemoverCPU *this,Mat *frame,double timestamp,string *error)

{
  double dVar1;
  bool bVar2;
  FlickerRemoverCPU *this_00;
  reference m;
  _InputArray *p_Var3;
  BooleanArray2D *pBVar4;
  anon_class_16_2_738b8782 local_350;
  anon_class_32_4_cd9ab351 local_340;
  BooleanArray2D *local_320;
  BooleanArray2D *old_similarity_levels_1;
  BooleanArray2D *new_similarity_levels_1;
  Mat *prev_frame;
  FlickerRemoverCPU **local_300;
  BooleanArray2D *local_2f8;
  BooleanArray2D *local_2f0;
  BooleanArray2D *local_2e8;
  BooleanArray2D *old_similarity_levels;
  BooleanArray2D *new_similarity_levels;
  Mat *last_frame;
  _InputArray local_2b8;
  _InputArray local_2a0;
  _OutputArray local_288;
  FlickerRemoverCPU *local_270;
  Mat *frame_copy;
  undefined1 local_260 [4];
  uint number_of_dropped;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *error_local;
  double timestamp_local;
  Mat *frame_local;
  FlickerRemoverCPU *this_local;
  
  local_30 = error;
  error_local = (string *)timestamp;
  timestamp_local = (double)frame;
  frame_local = (Mat *)this;
  if ((*(int *)(frame + 8) == this->frame_rows) && (*(int *)(frame + 0xc) == this->frame_cols)) {
    bVar2 = timestampIsCloseToExpectedTimestamp(this,timestamp);
    if (!bVar2) {
      if ((double)error_local < this->expected_timestamp) {
        std::__cxx11::to_string(&local_240,(double)error_local);
        std::operator+(&local_220,"Received unexpected timestamp: ",&local_240);
        std::operator+(&local_200,&local_220," Expected value close to: ");
        std::__cxx11::to_string((string *)local_260,this->expected_timestamp);
        std::operator+(&local_1e0,&local_200,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_260);
        std::__cxx11::string::operator=((string *)local_30,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)local_260);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        return (Mat *)0x0;
      }
      frame_copy._4_4_ =
           (int)(long)((((double)error_local - this->expected_timestamp) +
                       this->accepted_timestamp_difference) / this->timestamps_delta);
      this->actual_mask = (this->actual_mask + frame_copy._4_4_) % (this->number_of_masks + 1);
      this->expected_timestamp = (double)error_local;
    }
    calculateNextExpectedTimestamp(this,(double)error_local);
    this_00 = (FlickerRemoverCPU *)operator_new(0x60);
    cv::Mat::Mat((Mat *)this_00);
    dVar1 = timestamp_local;
    local_270 = this_00;
    if (this->actual_mask == this->number_of_masks) {
      this->actual_mask = 0;
      cv::_OutputArray::_OutputArray(&local_288,(Mat *)this_00);
      cv::Mat::convertTo((_OutputArray *)dVar1,(int)&local_288,1.0,0.0);
      cv::_OutputArray::~_OutputArray(&local_288);
    }
    else {
      cv::_InputArray::_InputArray(&local_2a0,(Mat *)timestamp_local);
      m = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                    (&this->masks,(ulong)this->actual_mask);
      cv::_InputArray::_InputArray(&local_2b8,m);
      cv::_OutputArray::_OutputArray((_OutputArray *)&last_frame,(Mat *)local_270);
      p_Var3 = (_InputArray *)cv::noArray();
      cv::subtract(&local_2a0,&local_2b8,(_OutputArray *)&last_frame,p_Var3,4);
      cv::_OutputArray::~_OutputArray((_OutputArray *)&last_frame);
      cv::_InputArray::~_InputArray(&local_2b8);
      cv::_InputArray::~_InputArray(&local_2a0);
      this->actual_mask = this->actual_mask + 1;
    }
    new_similarity_levels = (BooleanArray2D *)CircularBuffer<cv::Mat_*>::last(&this->frames_block);
    if (new_similarity_levels != (BooleanArray2D *)0x0) {
      pBVar4 = (BooleanArray2D *)operator_new(0x10);
      BooleanArray2D::BooleanArray2D(pBVar4,this->frame_rows,this->frame_cols);
      old_similarity_levels = pBVar4;
      local_2f0 = CircularBuffer<BooleanArray2D_*>::push
                            (&this->adjacent_frames_similarity_levels,pBVar4);
      local_300 = &local_270;
      local_2f8 = old_similarity_levels;
      prev_frame = (Mat *)this;
      local_2e8 = local_2f0;
      cv::Mat::
      forEach<int,FlickerRemoverCPU::removeFlickering(cv::Mat_const&,double,std::__cxx11::string&)::__0>
                ((Mat *)new_similarity_levels,(anon_class_32_4_cd9ab351 *)&prev_frame);
      pBVar4 = local_2e8;
      if (local_2e8 != (BooleanArray2D *)0x0) {
        BooleanArray2D::~BooleanArray2D(local_2e8);
        operator_delete(pBVar4,0x10);
      }
    }
    new_similarity_levels_1 =
         (BooleanArray2D *)CircularBuffer<cv::Mat_*>::push(&this->frames_block,(Mat *)local_270);
    if (new_similarity_levels_1 != (BooleanArray2D *)0x0) {
      pBVar4 = (BooleanArray2D *)operator_new(0x10);
      BooleanArray2D::BooleanArray2D(pBVar4,this->frame_rows,this->frame_cols);
      old_similarity_levels_1 = pBVar4;
      local_340.old_similarity_levels =
           CircularBuffer<BooleanArray2D_*>::push
                     (&this->corresponding_frames_similarity_levels,pBVar4);
      local_340.frame_copy = (Mat **)&local_270;
      local_340.new_similarity_levels = old_similarity_levels_1;
      local_340.this = this;
      local_320 = local_340.old_similarity_levels;
      cv::Mat::
      forEach<int,FlickerRemoverCPU::removeFlickering(cv::Mat_const&,double,std::__cxx11::string&)::__1>
                ((Mat *)new_similarity_levels_1,&local_340);
      pBVar4 = local_320;
      if (local_320 != (BooleanArray2D *)0x0) {
        BooleanArray2D::~BooleanArray2D(local_320);
        operator_delete(pBVar4,0x10);
      }
    }
    if ((this->actual_mask == this->number_of_masks) &&
       (bVar2 = CircularBuffer<cv::Mat_*>::isFull(&this->frames_block), bVar2)) {
      local_350.frame_copy = (Mat **)&local_270;
      local_350.this = this;
      cv::Mat::
      forEach<unsigned_char,FlickerRemoverCPU::removeFlickering(cv::Mat_const&,double,std::__cxx11::string&)::__2>
                (&this->flicker_counter,&local_350);
    }
    this_local = local_270;
  }
  else {
    std::__cxx11::to_string(&local_150,*(int *)(frame + 0xc));
    std::operator+(&local_130,"Flickering cannot be removed. Size of the frame: ",&local_150);
    std::operator+(&local_110,&local_130,"x");
    std::__cxx11::to_string(&local_180,*(int *)((long)timestamp_local + 8));
    std::operator+(&local_f0,&local_110,&local_180);
    std::operator+(&local_d0,&local_f0," is different than expected: ");
    std::__cxx11::to_string(&local_1a0,this->frame_cols);
    std::operator+(&local_b0,&local_d0,&local_1a0);
    std::operator+(&local_90,&local_b0,"x");
    std::__cxx11::to_string(&local_1c0,this->frame_rows);
    std::operator+(&local_70,&local_90,&local_1c0);
    std::operator+(&local_50,&local_70,".");
    std::__cxx11::string::operator=((string *)local_30,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    this_local = (FlickerRemoverCPU *)0x0;
  }
  return (Mat *)this_local;
}

Assistant:

Mat *FlickerRemoverCPU::removeFlickering(const Mat &frame, double timestamp, string &error)
{
    if(frame.rows != frame_rows || frame.cols != frame_cols) {
        error = "Flickering cannot be removed. Size of the frame: " + to_string(frame.cols) + "x" +
                to_string(frame.rows) + " is different than expected: " + to_string(frame_cols) + "x" +
                to_string(frame_rows) + ".";
        return nullptr;
    }
    if(!timestampIsCloseToExpectedTimestamp(timestamp)) {
        //very unlikely. Should not happen...
        if(timestamp < expected_timestamp) {
            error = "Received unexpected timestamp: " + to_string(timestamp) + " Expected value close to: " +
                    to_string(expected_timestamp);
            return nullptr;
        }
        //calculate number of frames that were dropped
        auto number_of_dropped = (unsigned int) ((timestamp - expected_timestamp + accepted_timestamp_difference) /
                                                 timestamps_delta);
        actual_mask = (actual_mask + number_of_dropped) % (number_of_masks + 1);
        expected_timestamp = timestamp;
    }
    calculateNextExpectedTimestamp(timestamp);

    auto frame_copy = new Mat();

    if(actual_mask == number_of_masks) {
        actual_mask = 0;
        frame.convertTo(*frame_copy, CV_32S);
    } else {
        subtract(frame, masks[actual_mask], *frame_copy, noArray(), CV_32S);
        actual_mask++;
    }

    auto last_frame = frames_block.last();
    if(last_frame != nullptr) {
        auto new_similarity_levels = new BooleanArray2D((unsigned int) frame_rows, (unsigned int) frame_cols);
        auto old_similarity_levels = adjacent_frames_similarity_levels.push(new_similarity_levels);

        last_frame->forEach<int>(
                [this, &frame_copy, new_similarity_levels, old_similarity_levels](int &value, const int *position) {
                    int row = position[0];
                    int col = position[1];
                    bool pixels_are_similar = similar(value, frame_copy->at<int>(row, col));
                    new_similarity_levels->set((unsigned int) row, (unsigned int) col, pixels_are_similar);
                    adjacent_frames_similarity_sum.at<unsigned char>(row, col) +=
                            (unsigned char) pixels_are_similar -
                            (unsigned char) old_similarity_levels->at((unsigned int) row, (unsigned int) col);
                });
        delete old_similarity_levels;
    }

    //push returns pointer to the allocated earlier matrix, but do not delete, since we already returned this pointer
    //outside of this method, and it is the responsibility of the caller to delete this pointer.
    auto prev_frame = frames_block.push(frame_copy);

    if(prev_frame != nullptr) {
        auto new_similarity_levels = new BooleanArray2D((unsigned int) frame_rows, (unsigned int) frame_cols);
        auto old_similarity_levels = corresponding_frames_similarity_levels.push(new_similarity_levels);
        prev_frame->forEach<int>(
                [this, &frame_copy, new_similarity_levels, old_similarity_levels](int &value, const int *position) {
                    int row = position[0];
                    int col = position[1];
                    bool pixels_are_similar = similar(value, frame_copy->at<int>(row, col));
                    new_similarity_levels->set((unsigned int) row, (unsigned int) col, pixels_are_similar);
                    corresponding_frames_similarity_sum.at<unsigned char>(row, col) +=
                            (unsigned char) pixels_are_similar -
                            (unsigned char) old_similarity_levels->at((unsigned int) row, (unsigned int) col);
                });
        delete old_similarity_levels;
    }

    if(actual_mask == number_of_masks && frames_block.isFull()) {
        flicker_counter.forEach<unsigned char>([this, &frame_copy](unsigned char &value, const int *position) {
            int row = position[0];
            int col = position[1];
            if(corresponding_frames_similarity_sum.at<unsigned char>(row, col) > 0.7 * block_size) {
                bool values_similar = true;
                unsigned int block_number = 0;
                while(values_similar && block_number + 1 < frames_block.maxSize()) {
                    values_similar = similar(frames_block[(int) block_number]->at<int>(row, col),
                                             frames_block[(int) block_number + 1]->at<int>(row, col));
                    block_number++;
                }
                if(!values_similar) {
                    value++;
                } else {
                    value = 0;
                }
            } else {
                value = 0;
            }
            if(value > max_allowed_flicker_duration) {
                for(int i = 0; i < (int) number_of_masks; i++) {
                    masks[i].at<int>(row, col) +=
                            frames_block[i + 1]->at<int>(row, col) - frames_block[0]->at<int>(row, col);
                }
                value = 0;
                //subtract mask from frame copy, but be sure that result is between 0-255
                auto mask_val = masks[number_of_masks - 1].at<int>(row, col);
                auto &frame_copy_val = frame_copy->at<int>(row, col);
                if(mask_val >= 0) {
                    if(frame_copy_val >= mask_val) {
                        frame_copy_val -= mask_val;
                    } else {
                        frame_copy_val = 0;
                    }
                } else {
                    if((int) frame_copy_val - mask_val > 255) {
                        frame_copy_val = 255;
                    } else {
                        frame_copy_val -= mask_val;
                    }
                }
            }
        });
    }
    return frame_copy;
}